

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall llbuild::core::BuildEngine::dumpGraphToFile(BuildEngine *this,string *path)

{
  BuildEngineImpl *this_00;
  BuildEngineDelegate *pBVar1;
  RuleInfo *pRVar2;
  RuleInfo *pRVar3;
  long lVar4;
  FILE *__s;
  pointer *pppRVar5;
  pointer ppRVar6;
  pointer *pppRVar7;
  RuleInfo *pRVar8;
  pointer *this_01;
  ulong uVar9;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n;
  size_t __n_00;
  iterator __begin2;
  __node_base *p_Var10;
  pointer __p;
  pointer *pppRVar11;
  long lVar12;
  pointer *pppRVar13;
  KeyIDAndFlags KVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Twine local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (BuildEngineImpl *)this->impl;
  __s = fopen((path->_M_dataplus)._M_p,"w");
  if (__s == (FILE *)0x0) {
    pBVar1 = this_00->delegate;
    std::operator+(&local_50,"unable to open graph output path \"",path);
    std::operator+(&local_88,&local_50,"\"");
    llvm::Twine::Twine(&local_68,&local_88);
    (*pBVar1->_vptr_BuildEngineDelegate[7])(pBVar1,&local_68);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return;
  }
  fwrite("digraph llbuild {\n",0x12,1,__s);
  fwrite("rankdir=\"LR\"\n",0xd,1,__s);
  fwrite("node [fontsize=10, shape=box, height=0.25]\n",0x2b,1,__s);
  fwrite("edge [fontsize=10]\n",0x13,1,__s);
  fputc(10,__s);
  p_Var10 = &(this_00->ruleInfos)._M_h._M_before_begin;
  pppRVar5 = (pointer *)0x0;
  pppRVar11 = (pointer *)0x0;
  this_01 = (pointer *)0x0;
  while( true ) {
    lVar12 = (long)this_01 - (long)pppRVar11;
    while( true ) {
      p_Var10 = p_Var10->_M_nxt;
      if (p_Var10 == (__node_base *)0x0) {
        pppRVar7 = this_01;
        if (pppRVar11 != this_01) {
          uVar9 = -lVar12 >> 3;
          lVar4 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const**,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::BuildEngineImpl::dumpGraphToFile(std::__cxx11::string_const&)::_lambda((anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*)_1_>>
                    (this_01,pppRVar11,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
          if (-lVar12 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const**,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::BuildEngineImpl::dumpGraphToFile(std::__cxx11::string_const&)::_lambda((anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*)_1_>>
                      (this_01,pppRVar11);
          }
          else {
            pppRVar13 = this_01 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const**,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::BuildEngineImpl::dumpGraphToFile(std::__cxx11::string_const&)::_lambda((anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*)_1_>>
                      (this_01,pppRVar13);
            for (; pppRVar11 != pppRVar13; pppRVar13 = pppRVar13 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const**,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::BuildEngineImpl::dumpGraphToFile(std::__cxx11::string_const&)::_lambda((anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*)_1_>>
                        (pppRVar13);
            }
          }
        }
        for (; pppRVar11 != pppRVar7; pppRVar7 = pppRVar7 + 1) {
          fprintf(__s,"\"%s\"\n",
                  ((*pppRVar7)[1]->rule)._M_t.
                  super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                  .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
          ppRVar6 = *pppRVar7;
          local_88._M_dataplus._M_p = (pointer)(ppRVar6 + 9);
          local_88._M_string_length = 0;
          pRVar2 = ppRVar6[10];
          pRVar3 = ppRVar6[9];
          for (; local_88._M_string_length != (long)pRVar2 - (long)pRVar3 >> 3;
              local_88._M_string_length = local_88._M_string_length + 1) {
            KVar14 = DependencyKeyIDs::const_iterator::operator*((const_iterator *)&local_88);
            pRVar8 = anon_unknown.dwarf_157793::BuildEngineImpl::getRuleInfoForKey
                               (this_00,KVar14.keyID._value);
            fprintf(__s,"\"%s\" -> \"%s\"\n",
                    ((*pppRVar7)[1]->rule)._M_t.
                    super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                    .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl,
                    (pointer)(((pRVar8->rule)._M_t.
                               super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                               .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl)->
                             key).key._M_dataplus);
          }
          fputc(10,__s);
        }
        fwrite("}\n",2,1,__s);
        fclose(__s);
        std::
        _Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
        ::_M_deallocate((_Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                         *)this_01,(pointer)((long)pppRVar5 - (long)this_01 >> 3),__n_00);
        return;
      }
      if (pppRVar11 == pppRVar5) break;
      *pppRVar11 = (pointer)(p_Var10 + 2);
      pppRVar11 = pppRVar11 + 1;
      lVar12 = lVar12 + -8;
    }
    if (lVar12 == -0x7ffffffffffffff8) break;
    __p = (pointer)(-lVar12 >> 3);
    ppRVar6 = __p;
    if (pppRVar11 == this_01) {
      ppRVar6 = (pointer)0x1;
    }
    uVar9 = (long)ppRVar6 + (long)__p;
    if (0xffffffffffffffe < uVar9) {
      uVar9 = 0xfffffffffffffff;
    }
    if (CARRY8((ulong)ppRVar6,(ulong)__p)) {
      uVar9 = 0xfffffffffffffff;
    }
    if (uVar9 == 0) {
      pppRVar7 = (pointer *)0x0;
      __n = 0;
    }
    else {
      pppRVar7 = (pointer *)operator_new(uVar9 * 8);
      __n = extraout_RDX;
    }
    pppRVar7[(long)__p] = (pointer)(p_Var10 + 2);
    if (lVar12 < 0) {
      memmove(pppRVar7,this_01,-lVar12);
      __n = extraout_RDX_00;
    }
    pppRVar11 = (pointer *)((long)pppRVar7 + (8 - lVar12));
    std::
    _Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
    ::_M_deallocate((_Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>
                     *)this_01,__p,__n);
    pppRVar5 = pppRVar7 + uVar9;
    this_01 = pppRVar7;
  }
  std::__throw_length_error("vector::_M_realloc_insert");
}

Assistant:

void BuildEngine::dumpGraphToFile(const std::string& path) {
  static_cast<BuildEngineImpl*>(impl)->dumpGraphToFile(path);
}